

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_>::Data
          (Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *this,
          Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *other,size_t reserved)

{
  long lVar1;
  undefined7 uVar2;
  bool bVar3;
  size_t sVar4;
  QPlatformTextureList **ppQVar5;
  Node<QPlatformTextureList_*,_bool> *pNVar6;
  Node<QPlatformTextureList_*,_bool> *pNVar7;
  long in_RSI;
  Span<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar8;
  size_t otherNSpans;
  Node<QPlatformTextureList_*,_bool> *newNode;
  Node<QPlatformTextureList_*,_bool> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *this_00;
  QPlatformTextureList **key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  QPlatformTextureList **local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)(in_RDI->offsets + 8) = *(undefined8 *)(in_RSI + 8);
  in_RDI->offsets[0x10] = '\0';
  in_RDI->offsets[0x11] = '\0';
  in_RDI->offsets[0x12] = '\0';
  in_RDI->offsets[0x13] = '\0';
  in_RDI->offsets[0x14] = '\0';
  in_RDI->offsets[0x15] = '\0';
  in_RDI->offsets[0x16] = '\0';
  in_RDI->offsets[0x17] = '\0';
  *(undefined8 *)(in_RDI->offsets + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  in_RDI->offsets[0x20] = '\0';
  in_RDI->offsets[0x21] = '\0';
  in_RDI->offsets[0x22] = '\0';
  in_RDI->offsets[0x23] = '\0';
  in_RDI->offsets[0x24] = '\0';
  in_RDI->offsets[0x25] = '\0';
  in_RDI->offsets[0x26] = '\0';
  in_RDI->offsets[0x27] = '\0';
  qMax<unsigned_long>((unsigned_long *)(in_RDI->offsets + 8),&local_20);
  sVar4 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  *(size_t *)(in_RDI->offsets + 0x10) = sVar4;
  RVar8 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)(in_RDI->offsets + 0x20) = RVar8.spans;
  ppQVar5 = (QPlatformTextureList **)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = ppQVar5;
  for (local_40 = (QPlatformTextureList **)0x0; local_40 < ppQVar5;
      local_40 = (QPlatformTextureList **)((long)local_40 + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar3 = Span<QHashPrivate::Node<QPlatformTextureList_*,_bool>_>::hasNode
                        ((Span<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar3) {
        pNVar6 = Span<QHashPrivate::Node<QPlatformTextureList_*,_bool>_>::at(this_00,(size_t)in_RDI)
        ;
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = Data<QHashPrivate::Node<QPlatformTextureList*,bool>>::
                   findBucket<QPlatformTextureList*>
                             ((Data<QHashPrivate::Node<QPlatformTextureList_*,_bool>_> *)RVar8.spans
                              ,key);
        pNVar7 = Bucket::insert((Bucket *)0x3aeef7);
        pNVar7->key = pNVar6->key;
        uVar2 = *(undefined7 *)&pNVar6->field_0x9;
        pNVar7->value = pNVar6->value;
        *(undefined7 *)&pNVar7->field_0x9 = uVar2;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }